

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int log_create(char *name)

{
  log_impl impl_00;
  char *in_RDI;
  log_impl impl;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  impl_00 = log_impl_create(in_RDI);
  if (impl_00 == (log_impl)0x0) {
    iVar1 = 1;
  }
  else {
    log_impl_name(impl_00);
    iVar1 = log_singleton_insert(in_RDI,impl_00);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      log_impl_destroy((log_impl)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int log_create(const char *name)
{
	log_impl impl = log_impl_create(name);

	if (impl == NULL)
	{
		return 1;
	}

	if (log_singleton_insert(log_impl_name(impl), impl) != 0)
	{
		log_impl_destroy(impl);

		return 1;
	}

	return 0;
}